

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *pNtk)

{
  byte *pbVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  uint *__ptr;
  void *pvVar6;
  Vec_Ptr_t *vBoxIns;
  void **ppvVar7;
  uint *__ptr_00;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ushort uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong local_70;
  ulong local_58;
  ulong local_50;
  uint local_3c;
  
  uVar17 = pNtk->nObjCounts[8];
  __ptr = (uint *)malloc(0x10);
  local_70 = 8;
  if (6 < uVar17 - 1) {
    local_70 = (ulong)uVar17;
  }
  __ptr[1] = 0;
  uVar17 = (uint)local_70;
  *__ptr = uVar17;
  if (uVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar17 * 8);
  }
  *(void **)(__ptr + 2) = pvVar6;
  vBoxIns = (Vec_Ptr_t *)malloc(0x10);
  local_58 = 0;
  vBoxIns->nSize = 0;
  vBoxIns->nCap = uVar17;
  if (uVar17 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)(int)uVar17 << 3);
  }
  vBoxIns->pArray = ppvVar7;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar6 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar6;
  pVVar9 = pNtk->vBoxes;
  if (0 < pVVar9->nSize) {
    local_58 = 0;
    iVar19 = 0;
    lVar13 = 0;
    local_50 = local_70;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      iVar5 = (int)local_58;
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
        ppvVar7 = pAVar2->pNtk->vObjs->pArray;
        pAVar3 = (Abc_Obj_t *)ppvVar7[*(pAVar2->vFanouts).pArray];
        if (((*(uint *)&pAVar3->field_0x14 & 0xf) != 5) ||
           (pAVar4 = (Abc_Obj_t *)ppvVar7[*(pAVar2->vFanins).pArray],
           (*(uint *)&pAVar4->field_0x14 & 0xf) != 4)) {
          __assert_fail("Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                        ,0x338,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        iVar16 = (int)local_70;
        if (iVar19 == iVar16) {
          if (iVar16 < 0x10) {
            if (vBoxIns->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vBoxIns->pArray,0x80);
            }
            vBoxIns->pArray = ppvVar7;
            vBoxIns->nCap = 0x10;
            local_70 = 0x10;
          }
          else {
            local_70 = (ulong)(uint)(iVar16 * 2);
            if (vBoxIns->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(local_70 * 8);
            }
            else {
              ppvVar7 = (void **)realloc(vBoxIns->pArray,local_70 * 8);
            }
            vBoxIns->pArray = ppvVar7;
            vBoxIns->nCap = iVar16 * 2;
          }
        }
        else {
          ppvVar7 = vBoxIns->pArray;
        }
        iVar16 = iVar19 + 1;
        vBoxIns->nSize = iVar16;
        ppvVar7[iVar19] = pAVar4;
        Abc_FlowRetime_CopyInitState(pAVar2,pAVar3);
        iVar19 = (int)local_50;
        if (iVar5 == iVar19) {
          if (iVar19 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = 0x10;
            local_50 = 0x10;
          }
          else {
            local_50 = (ulong)(uint)(iVar19 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(local_50 * 8);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),local_50 * 8);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = iVar19 * 2;
          }
        }
        else {
          pvVar6 = *(void **)(__ptr + 2);
        }
        local_58 = (ulong)(iVar5 + 1U);
        __ptr[1] = iVar5 + 1U;
        *(Abc_Obj_t **)((long)pvVar6 + (long)iVar5 * 8) = pAVar2;
        *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) =
             *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) | 8;
        Abc_ObjPatchFanin(pAVar3,pAVar2,pAVar4);
        Abc_ObjRemoveFanins(pAVar2);
        pcVar8 = Nm_ManFindNameById(pNtk->pManName,pAVar2->Id);
        iVar19 = iVar16;
        if (pcVar8 != (char *)0x0) {
          Nm_ManDeleteIdName(pNtk->pManName,pAVar2->Id);
        }
      }
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vBoxes;
    } while (lVar13 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vObjs;
  if (pVVar9->nSize < 1) {
    local_3c = 0;
    uVar17 = 0;
  }
  else {
    lVar13 = 0;
    local_70 = 100;
    uVar17 = 0;
    local_3c = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      if (((pAVar2 != (Abc_Obj_t *)0x0) &&
          (uVar10 = *(uint *)&pAVar2->field_0x14 & 0xf, uVar10 != 8)) &&
         (uVar12 = *(uint *)(pManMR->pDataArray + (uint)pAVar2->Id), (uVar12 >> 8 & 1) == 0)) {
        uVar15 = (ushort)uVar12 & 3;
        if (uVar15 == 1 && pManMR->fIsForward != 0) {
          __assert_fail("!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                        ,0x351,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        if (uVar15 == 2) {
          if ((uVar12 & 4) == 0) {
            __assert_fail("FTEST(pObj, FLOW)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                          ,0x353,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
          }
          if (pManMR->fIsForward == 0) {
            if (uVar10 == 4) goto LAB_004d7795;
          }
          else if (uVar10 == 5) {
LAB_004d7795:
            local_3c = local_3c + 1;
          }
          iVar19 = (pAVar2->vFanouts).nSize;
          if (0 < iVar19) {
            uVar17 = uVar17 + 1;
            uVar10 = 0;
            lVar18 = 0;
            do {
              pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[lVar18]];
              iVar5 = Abc_FlowRetime_IsAcrossCut(pAVar2,pAVar3);
              if (iVar5 != 0) {
                uVar12 = (uint)local_70;
                if (uVar10 == uVar12) {
                  if ((int)uVar12 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar6 = malloc(0x80);
                    }
                    else {
                      pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar6;
                    *__ptr_00 = 0x10;
                    local_70 = 0x10;
                  }
                  else {
                    local_70 = (ulong)(uVar12 * 2);
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar6 = malloc(local_70 * 8);
                    }
                    else {
                      pvVar6 = realloc(*(void **)(__ptr_00 + 2),local_70 * 8);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar6;
                    *__ptr_00 = uVar12 * 2;
                  }
                }
                else {
                  pvVar6 = *(void **)(__ptr_00 + 2);
                }
                lVar11 = (long)(int)uVar10;
                uVar10 = uVar10 + 1;
                *(Abc_Obj_t **)((long)pvVar6 + lVar11 * 8) = pAVar3;
                iVar19 = (pAVar2->vFanouts).nSize;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < iVar19);
            if (uVar10 != 0) {
              if ((int)uVar10 < 1) goto LAB_004d7b9e;
              if ((int)local_58 == 0) {
                __assert_fail("Vec_PtrSize( vFreeRegs )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                              ,0x367,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
              }
              if (0 < (int)local_58) {
                uVar12 = (int)local_58 - 1;
                local_58 = (ulong)uVar12;
                __ptr[1] = uVar12;
                pAVar3 = *(Abc_Obj_t **)(*(long *)(__ptr + 2) + local_58 * 8);
                Abc_ObjAddFanin(pAVar3,pAVar2);
                uVar14 = (ulong)uVar10;
                do {
                  if ((int)uVar14 < 1) goto LAB_004d7af8;
                  pAVar4 = *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + -8 + uVar14 * 8);
                  Abc_ObjPatchFanin(pAVar4,pAVar2,pAVar3);
                  if (((*(uint *)&pAVar4->field_0x14 & 0xf) == 4) && ((pAVar4->vFanins).nSize != 1))
                  {
                    __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                                  ,0x36e,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
                  }
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
                __ptr_00[1] = 0;
                pVVar9 = pNtk->vObjs;
                goto LAB_004d792d;
              }
              goto LAB_004d7af8;
            }
          }
          print_node(pAVar2);
LAB_004d7b9e:
          __assert_fail("Vec_PtrSize(vMove) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                        ,0x364,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
      }
LAB_004d792d:
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  fPathError = 0;
  if (pManMR->fVerbose != 0) {
    printf("\t\tVerifying latency along all paths...");
    pVVar9 = pNtk->vObjs;
  }
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        uVar10 = *(uint *)&pAVar2->field_0x14 & 0xf;
        if ((uVar10 == 5) || ((uVar10 == 2 && (pManMR->fIsForward == 0)))) {
          Abc_FlowRetime_VerifyPathLatencies_rec(pAVar2,0);
        }
        if (fPathError != 0) {
          if (0 < (pAVar2->vFanins).nSize) {
            printf("fanin ");
            print_node((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
          }
          putchar(10);
          exit(0);
        }
        pVVar9 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  if (pManMR->fVerbose != 0) {
    puts(" ok");
    pVVar9 = pNtk->vObjs;
  }
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      if (pVVar9->pArray[lVar13] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar9->pArray[lVar13] + 0x14);
        *pbVar1 = *pbVar1 & 0x8f;
        pVVar9 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  if ((int)local_58 != 0) {
    do {
      if ((int)local_58 < 1) {
LAB_004d7af8:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      local_58 = local_58 - 1;
      Abc_NtkDeleteObj(*(Abc_Obj_t **)(*(long *)(__ptr + 2) + (local_58 & 0xffffffff) * 8));
    } while ((local_58 & 0xffffffff) != 0);
  }
  Abc_FlowRetime_UpdateLags();
  Abc_FlowRetime_InitState(pNtk);
  Abc_FlowRetime_FixLatchBoxes(pNtk,vBoxIns);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  if (vBoxIns->pArray != (void **)0x0) {
    free(vBoxIns->pArray);
  }
  free(vBoxIns);
  if (pManMR->fVerbose != 0) {
    printf("\t\tmin-cut = %d (unmoved = %d)\n",(ulong)uVar17,(ulong)local_3c);
  }
  return uVar17;
}

Assistant:

int
Abc_FlowRetime_ImplementCut( Abc_Ntk_t * pNtk ) {
  int i, j, cut = 0, unmoved = 0;
  Abc_Obj_t *pObj, *pReg, *pNext, *pBo = NULL, *pBi = NULL;
  Vec_Ptr_t *vFreeRegs = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vBoxIns = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vMove = Vec_PtrAlloc( 100 );

  // remove latches from netlist
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pBo = Abc_ObjFanout0(pObj);
    pBi = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi));
    Vec_PtrPush( vBoxIns, pBi );

    // copy initial state values to BO
    Abc_FlowRetime_CopyInitState( pObj, pBo );

    // re-use latch elsewhere
    Vec_PtrPush( vFreeRegs, pObj );
    FSET(pBo, CROSS_BOUNDARY);

    // cut out of netlist
    Abc_ObjPatchFanin( pBo, pObj, pBi );
    Abc_ObjRemoveFanins( pObj );

    // free name
    if (Nm_ManFindNameById(pNtk->pManName, Abc_ObjId(pObj)))
      Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj));
  }

  // insert latches into netlist
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (Abc_ObjIsLatch( pObj )) continue;
    if (FTEST(pObj, BIAS_NODE)) continue;
    
    // a latch is required on every node that lies across the min-cit
    assert(!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R));
    if (FTEST(pObj, VISITED_R) && !FTEST(pObj, VISITED_E)) {
      assert(FTEST(pObj, FLOW));

      // count size of cut
      cut++;
      if ((pManMR->fIsForward && Abc_ObjIsBo(pObj)) || 
          (!pManMR->fIsForward && Abc_ObjIsBi(pObj)))
        unmoved++;
      
      // only insert latch between fanouts that lie across min-cut
      // some fanout paths may be cut at deeper points
      Abc_ObjForEachFanout( pObj, pNext, j )
        if (Abc_FlowRetime_IsAcrossCut( pObj, pNext ))
          Vec_PtrPush(vMove, pNext);

      // check that move-set is non-zero
      if (Vec_PtrSize(vMove) == 0)
        print_node(pObj);
      assert(Vec_PtrSize(vMove) > 0);
      
      // insert one of re-useable registers
      assert(Vec_PtrSize( vFreeRegs ));
      pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
      
      Abc_ObjAddFanin(pReg, pObj);
      while(Vec_PtrSize( vMove )) {
        pNext = (Abc_Obj_t *)Vec_PtrPop( vMove );
        Abc_ObjPatchFanin( pNext, pObj, pReg );
        if (Abc_ObjIsBi(pNext)) assert(Abc_ObjFaninNum(pNext) == 1);

      }
      // APH: broken by bias nodes  if (Abc_ObjIsBi(pObj)) assert(Abc_ObjFaninNum(pObj) == 1);
    }
  }

#if defined(DEBUG_CHECK)        
  Abc_FlowRetime_VerifyPathLatencies( pNtk );
#endif

  // delete remaining latches
  while(Vec_PtrSize( vFreeRegs )) {
    pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
    Abc_NtkDeleteObj( pReg );
  }
  
  // update initial states
  Abc_FlowRetime_UpdateLags( );
  Abc_FlowRetime_InitState( pNtk );

  // restore latch boxes
  Abc_FlowRetime_FixLatchBoxes( pNtk, vBoxIns );

  Vec_PtrFree( vFreeRegs );
  Vec_PtrFree( vMove );
  Vec_PtrFree( vBoxIns );

  vprintf("\t\tmin-cut = %d (unmoved = %d)\n", cut, unmoved);
  return cut;
}